

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int AddVidModeToList(VideoModeList *vmode,SDL12_Rect *mode,Uint16 maxw,Uint16 maxh)

{
  SDL12_Rect *pSVar1;
  int local_34;
  int i;
  void *ptr;
  Uint16 maxh_local;
  Uint16 maxw_local;
  SDL12_Rect *mode_local;
  VideoModeList *vmode_local;
  
  if (((maxw == 0) || (mode->w <= maxw)) && ((maxh == 0 || (mode->h <= maxh)))) {
    local_34 = 0;
    while ((local_34 < vmode->nummodes &&
           ((vmode->modeslist12[local_34].w != mode->w ||
            (vmode->modeslist12[local_34].h != mode->h))))) {
      local_34 = local_34 + 1;
    }
    if (local_34 < vmode->nummodes) {
      vmode_local._4_4_ = 0;
    }
    else {
      pSVar1 = (SDL12_Rect *)(*SDL20_realloc)(vmode->modeslist12,(long)(vmode->nummodes + 1) << 3);
      if (pSVar1 == (SDL12_Rect *)0x0) {
        vmode_local._4_4_ = (*SDL20_Error)(SDL_ENOMEM);
      }
      else {
        vmode->modeslist12 = pSVar1;
        (*SDL20_memcpy)(vmode->modeslist12 + vmode->nummodes,mode,8);
        vmode->nummodes = vmode->nummodes + 1;
        vmode_local._4_4_ = 0;
      }
    }
  }
  else {
    vmode_local._4_4_ = 0;
  }
  return vmode_local._4_4_;
}

Assistant:

static int
AddVidModeToList(VideoModeList *vmode, SDL12_Rect *mode, const Uint16 maxw, const Uint16 maxh)
{
    void *ptr = NULL;
    int i;

    if ( (maxw && (mode->w > maxw)) || (maxh && (mode->h > maxh)) ) {
        return 0;   /* clamp this one out as too big. */
    }

    /* make sure we don't have this one already (with a different refresh rate, etc). */
    for (i = 0; i < vmode->nummodes; i++) {
        if ((vmode->modeslist12[i].w == mode->w) && (vmode->modeslist12[i].h == mode->h)) {
            break;
        }
    }

    if (i < vmode->nummodes) {
        return 0;  /* already have this one. */
    }

    ptr = SDL20_realloc(vmode->modeslist12, sizeof (SDL12_Rect) * (vmode->nummodes + 1));
    if (ptr == NULL) {
        return SDL20_OutOfMemory();
    }
    vmode->modeslist12 = (SDL12_Rect *) ptr;

    SDL20_memcpy(&vmode->modeslist12[vmode->nummodes], mode, sizeof(vmode->modeslist12[vmode->nummodes]));
    vmode->nummodes++;

    return 0;
}